

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void user_name(char *buf,size_t len,int id)

{
  passwd *ppVar1;
  passwd *pw;
  int id_local;
  size_t len_local;
  char *buf_local;
  
  ppVar1 = getpwuid(id);
  if (((ppVar1 == (passwd *)0x0) || (ppVar1->pw_name == (char *)0x0)) || (*ppVar1->pw_name == '\0'))
  {
    my_strcpy(buf,"PLAYER",len);
  }
  else {
    my_strcpy(buf,ppVar1->pw_name,len);
    my_strcap(buf);
  }
  return;
}

Assistant:

static void user_name(char *buf, size_t len, int id)
{
	struct passwd *pw = getpwuid(id);

	/* Default to PLAYER */
	if (!pw || !pw->pw_name || !pw->pw_name[0] ) {
		my_strcpy(buf, "PLAYER", len);
		return;
	}

	/* Copy and capitalise */
	my_strcpy(buf, pw->pw_name, len);
	my_strcap(buf);
}